

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O3

void __thiscall
cmDocumentationFormatter::PrintFormatted(cmDocumentationFormatter *this,ostream *os,char *text)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  string paragraph;
  string preformatted;
  undefined1 *local_78;
  ulong local_70;
  undefined1 local_68;
  undefined7 uStack_67;
  undefined1 *local_58;
  ulong local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  ostream *local_38;
  
  if ((text != (char *)0x0) && (*text != '\0')) {
    local_38 = os;
    do {
      local_50 = 0;
      local_48 = 0;
      local_58 = &local_48;
      if (*text == ' ') {
        cVar2 = ' ';
        pcVar3 = text;
        do {
          while (cVar2 != '\n') {
            text = pcVar3;
            if (cVar2 == '\0') goto LAB_0022a62e;
            std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_50,0,'\x01');
            cVar2 = pcVar3[1];
            pcVar3 = pcVar3 + 1;
          }
          std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_50,0,'\x01');
          text = pcVar3 + 1;
          pcVar1 = pcVar3 + 1;
          cVar2 = ' ';
          pcVar3 = text;
        } while (*pcVar1 == ' ');
LAB_0022a62e:
        if (local_50 != 0) {
          (*this->_vptr_cmDocumentationFormatter[3])(this,local_38,local_58);
        }
      }
      local_78 = &local_68;
      local_70 = 0;
      local_68 = 0;
      for (; *text != '\0'; text = text + 1) {
        if (*text == '\n') {
          std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
          text = text + 1;
          break;
        }
        std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
      }
      if (local_70 != 0) {
        (*this->_vptr_cmDocumentationFormatter[4])(this,local_38);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
    } while (*text != '\0');
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintFormatted(std::ostream& os,
                                              const char* text)
{
  if(!text)
    {
    return;
    }
  const char* ptr = text;
  while(*ptr)
    {
    // Any ptrs starting in a space are treated as preformatted text.
    std::string preformatted;
    while(*ptr == ' ')
      {
      for(char ch = *ptr; ch && ch != '\n'; ++ptr, ch = *ptr)
        {
        preformatted.append(1, ch);
        }
      if(*ptr)
        {
        ++ptr;
        preformatted.append(1, '\n');
        }
      }
    if(!preformatted.empty())
      {
      this->PrintPreformatted(os, preformatted.c_str());
      }

    // Other ptrs are treated as paragraphs.
    std::string paragraph;
    for(char ch = *ptr; ch && ch != '\n'; ++ptr, ch = *ptr)
      {
      paragraph.append(1, ch);
      }
    if(*ptr)
      {
      ++ptr;
      paragraph.append(1, '\n');
      }
    if(!paragraph.empty())
      {
      this->PrintParagraph(os, paragraph.c_str());
      }
    }
}